

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O1

exception_ptr test_parse_fails(char *text)

{
  wstring_view text_00;
  char *in_RSI;
  size_t unaff_R15;
  wchar_t *unaff_retaddr;
  long *local_40 [2];
  long local_30 [2];
  
  strlen(in_RSI);
  local_40[0] = local_30;
  std::__cxx11::wstring::_M_construct<char_const*>((wstring *)local_40);
  text_00._M_str = unaff_retaddr;
  text_00._M_len = unaff_R15;
  test_parse_fails(text_00);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] * 4 + 4);
  }
  return (exception_ptr)text;
}

Assistant:

auto test_parse_fails(const char* text) {
    return test_parse_fails(std::wstring{text, text+std::strlen(text)});
}